

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  int *piVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  _func_int *p_Var13;
  size_t sVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  int i;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  float fVar25;
  
  p_Var13 = this->_vptr_Cast_x86_avx[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var13) == *(int *)(&this->field_0xd4 + (long)p_Var13)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar15 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar11;
    top_blob->h = iVar15;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar11 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar10 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar14 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var13)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var13) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx + (long)p_Var13),bottom_blob,top_blob,
                    opt);
    }
    sVar14 = sVar14 * 4;
    break;
  case 2:
  case 4:
    sVar14 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar14 = bottom_blob->elemsize;
  }
  switch(iVar10) {
  case 1:
    Mat::create(top_blob,iVar11,sVar14,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar11,iVar15,sVar14,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar11,iVar15,_c,sVar14,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar11,iVar15,iVar1,_c,sVar14,_elempack,opt->blob_allocator);
  }
  if (top_blob->data != (void *)0x0) {
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
       (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 2)) {
      iVar10 = cpu_support_x86_f16c();
      if (iVar10 == 0) {
        iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar19 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        uVar17 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar17 = uVar19;
        }
        for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          sVar14 = bottom_blob->cstep;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->elemsize;
          pvVar12 = bottom_blob->data;
          sVar6 = top_blob->elemsize;
          pvVar16 = top_blob->data;
          for (lVar21 = 0; iVar10 != (int)lVar21; lVar21 = lVar21 + 1) {
            uVar9 = float32_to_float16(*(float *)((long)pvVar12 +
                                                 lVar21 * 4 + sVar14 * sVar5 * uVar19));
            *(unsigned_short *)((long)pvVar16 + lVar21 * 2 + sVar4 * sVar6 * uVar19) = uVar9;
          }
        }
      }
      else {
        cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
      }
    }
    if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 2) &&
       (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
      iVar10 = cpu_support_x86_f16c();
      if (iVar10 == 0) {
        iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar19 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        uVar17 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar17 = uVar19;
        }
        for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          sVar14 = bottom_blob->cstep;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->elemsize;
          pvVar12 = bottom_blob->data;
          sVar6 = top_blob->elemsize;
          pvVar16 = top_blob->data;
          for (lVar21 = 0; iVar10 != (int)lVar21; lVar21 = lVar21 + 1) {
            fVar25 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar12 + lVar21 * 2 + sVar14 * sVar5 * uVar19));
            *(float *)((long)pvVar16 + lVar21 * 4 + sVar4 * sVar6 * uVar19) = fVar25;
          }
        }
      }
      else {
        cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
      }
    }
    pp_Var3 = this->_vptr_Cast_x86_avx;
    p_Var13 = pp_Var3[-3];
    iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    if (iVar10 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 1) {
        return 0;
      }
      uVar22 = iVar1 * _elempack * iVar15 * iVar11;
      pvVar12 = bottom_blob->data;
      sVar14 = bottom_blob->cstep;
      pvVar16 = top_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      uVar17 = 0;
      uVar19 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar19 = uVar17;
      }
      uVar20 = (ulong)_c;
      if ((int)_c < 1) {
        uVar20 = uVar17;
      }
      sVar6 = bottom_blob->elemsize;
      for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
          *(float *)((long)pvVar16 + uVar18 * 4) = (float)(int)*(char *)((long)pvVar12 + uVar18);
        }
        pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar5);
        pvVar12 = (void *)((long)pvVar12 + sVar14 * sVar6);
      }
      p_Var13 = pp_Var3[-3];
      iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    }
    if (iVar10 == 1) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 4) {
        return 0;
      }
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      pvVar12 = bottom_blob->data;
      sVar14 = bottom_blob->elemsize;
      pvVar16 = top_blob->data;
      sVar4 = top_blob->elemsize;
      sVar5 = top_blob->cstep;
      uVar19 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      uVar17 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar17 = uVar19;
      }
      sVar6 = bottom_blob->cstep;
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        for (lVar21 = 0; iVar11 != (int)lVar21; lVar21 = lVar21 + 1) {
          *(undefined2 *)((long)pvVar16 + lVar21 * 2) =
               *(undefined2 *)((long)pvVar12 + lVar21 * 4 + 2);
        }
        pvVar12 = (void *)((long)pvVar12 + sVar14 * sVar6);
        pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar5);
      }
      p_Var13 = pp_Var3[-3];
      iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    }
    if ((iVar10 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var13) == 1)) {
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar19 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar19 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
        pvVar12 = bottom_blob->data;
        sVar14 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar23 = (undefined1 (*) [16])(sVar4 * uVar17 * sVar14 + (long)pvVar12);
        pvVar16 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar24 = (undefined1 (*) [16])(sVar6 * uVar17 * sVar5 + (long)pvVar16);
        lVar21 = 0;
        for (iVar15 = 0; iVar15 + 7 < iVar11; iVar15 = iVar15 + 8) {
          auVar7 = vlddqu_avx(*pauVar23);
          auVar8 = vpunpcklwd_avx((undefined1  [16])0x0,auVar7);
          auVar7 = vpunpckhwd_avx((undefined1  [16])0x0,auVar7);
          pauVar24[1] = auVar7;
          *pauVar24 = auVar8;
          pauVar23 = pauVar23 + 1;
          pauVar24 = pauVar24 + 2;
          lVar21 = lVar21 + 8;
        }
        for (; (int)lVar21 < iVar11; lVar21 = lVar21 + 1) {
          *(uint *)((long)pvVar16 + lVar21 * 4 + sVar6 * sVar5 * uVar17) =
               (uint)*(ushort *)((long)pvVar12 + lVar21 * 2 + sVar4 * sVar14 * uVar17) << 0x10;
        }
      }
    }
    return 0;
  }
  return -100;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}